

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.cpp
# Opt level: O3

ContainerScanState * __thiscall
duckdb::roaring::RoaringScanState::LoadContainer
          (RoaringScanState *this,idx_t container_index,idx_t internal_offset)

{
  value_type vVar1;
  data_ptr_t pdVar2;
  uint8_t *this_00;
  bool bVar3;
  reference pvVar4;
  reference pvVar5;
  _Head_base<0UL,_duckdb::roaring::ContainerScanState_*,_false> _Var6;
  pointer pCVar7;
  type pCVar8;
  undefined *puVar9;
  idx_t iVar10;
  _Head_base<0UL,_duckdb::roaring::ContainerScanState_*,_false> _Var11;
  uint uVar12;
  data_ptr_t segments;
  validity_t *bitset;
  
  bVar3 = UseContainerStateCache(this,container_index,internal_offset);
  if (bVar3) goto LAB_016f112b;
  pvVar4 = vector<duckdb::roaring::ContainerMetadata,_true>::operator[]
                     (&this->container_metadata,container_index);
  vVar1 = *pvVar4;
  uVar12 = (uint)vVar1 >> 0x10;
  pdVar2 = this->data_ptr;
  pvVar5 = vector<unsigned_long,_true>::operator[](&this->data_start_position,container_index);
  bitset = (validity_t *)(pdVar2 + *pvVar5);
  iVar10 = (this->segment->super_SegmentBase<duckdb::ColumnSegment>).count.
           super___atomic_base<unsigned_long>._M_i + container_index * -0x800;
  if (0x7ff < iVar10) {
    iVar10 = 0x800;
  }
  if (vVar1.container_type == RUN_CONTAINER) {
    if ((uint)vVar1 < 0x40000) {
      _Var6._M_head_impl = (ContainerScanState *)operator_new(0x40);
      RunContainerScanState::RunContainerScanState
                ((RunContainerScanState *)_Var6._M_head_impl,container_index,iVar10,(ulong)uVar12,
                 (data_ptr_t)bitset);
    }
    else {
      _Var6._M_head_impl = (ContainerScanState *)operator_new(0x58);
      CompressedRunContainerScanState::CompressedRunContainerScanState
                ((CompressedRunContainerScanState *)_Var6._M_head_impl,container_index,iVar10,
                 (ulong)uVar12,(data_ptr_t)bitset,(data_ptr_t)(bitset + 1));
    }
LAB_016f10d3:
    _Var11._M_head_impl =
         (this->current_container).
         super_unique_ptr<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::roaring::ContainerScanState_*,_std::default_delete<duckdb::roaring::ContainerScanState>_>
         .super__Head_base<0UL,_duckdb::roaring::ContainerScanState_*,_false>._M_head_impl;
    (this->current_container).
    super_unique_ptr<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::roaring::ContainerScanState_*,_std::default_delete<duckdb::roaring::ContainerScanState>_>
    .super__Head_base<0UL,_duckdb::roaring::ContainerScanState_*,_false>._M_head_impl =
         _Var6._M_head_impl;
  }
  else {
    if (((uint)vVar1 & 0xff) == 2) {
      _Var6._M_head_impl = (ContainerScanState *)operator_new(0x28);
      BitsetContainerScanState::BitsetContainerScanState
                ((BitsetContainerScanState *)_Var6._M_head_impl,container_index,iVar10,bitset);
      goto LAB_016f10d3;
    }
    if (0x7ffff < (uint)vVar1) {
      _Var6._M_head_impl = (ContainerScanState *)operator_new(0x60);
      (((CompressedRunContainerScanState *)_Var6._M_head_impl)->super_RunContainerScanState).
      super_ContainerScanState.container_index = container_index;
      (((CompressedRunContainerScanState *)_Var6._M_head_impl)->super_RunContainerScanState).
      super_ContainerScanState.container_size = iVar10;
      (((CompressedRunContainerScanState *)_Var6._M_head_impl)->super_RunContainerScanState).
      super_ContainerScanState.scanned_count = 0;
      (((CompressedRunContainerScanState *)_Var6._M_head_impl)->super_RunContainerScanState).
      run_index = (idx_t)(bitset + 1);
      *(undefined1 *)
       &(((CompressedRunContainerScanState *)_Var6._M_head_impl)->super_RunContainerScanState).count
           = 0;
      (((CompressedRunContainerScanState *)_Var6._M_head_impl)->super_RunContainerScanState).data =
           (data_ptr_t)(ulong)uVar12;
      ((CompressedRunContainerScanState *)_Var6._M_head_impl)->segments = (data_ptr_t)0x0;
      this_00 = &(((CompressedRunContainerScanState *)_Var6._M_head_impl)->segment).index;
      if (((uint)vVar1 >> 8 & 1) == 0) {
        (((CompressedRunContainerScanState *)_Var6._M_head_impl)->super_RunContainerScanState).
        super_ContainerScanState._vptr_ContainerScanState =
             (_func_int **)&PTR__ContainerScanState_0246e828;
        (((CompressedRunContainerScanState *)_Var6._M_head_impl)->segment).segments =
             (uint8_t *)bitset;
        ContainerSegmentScan::ContainerSegmentScan
                  ((ContainerSegmentScan *)this_00,(data_ptr_t)bitset);
      }
      else {
        (((CompressedRunContainerScanState *)_Var6._M_head_impl)->super_RunContainerScanState).
        super_ContainerScanState._vptr_ContainerScanState =
             (_func_int **)&PTR__ContainerScanState_0246e778;
        (((CompressedRunContainerScanState *)_Var6._M_head_impl)->segment).segments =
             (uint8_t *)bitset;
        ContainerSegmentScan::ContainerSegmentScan
                  ((ContainerSegmentScan *)this_00,(data_ptr_t)bitset);
      }
      goto LAB_016f10d3;
    }
    _Var6._M_head_impl = (ContainerScanState *)operator_new(0x48);
    (_Var6._M_head_impl)->container_index = container_index;
    (_Var6._M_head_impl)->container_size = iVar10;
    (_Var6._M_head_impl)->scanned_count = 0;
    if (((uint)vVar1 >> 8 & 1) == 0) {
      puVar9 = &ArrayContainerScanState<false>::vtable;
    }
    else {
      puVar9 = &ArrayContainerScanState<true>::vtable;
    }
    (_Var6._M_head_impl)->_vptr_ContainerScanState = (_func_int **)(puVar9 + 0x10);
    _Var6._M_head_impl[1].container_index = (idx_t)bitset;
    *(undefined1 *)&_Var6._M_head_impl[1].container_size = 0;
    _Var6._M_head_impl[1].scanned_count = (idx_t)(ulong)uVar12;
    _Var6._M_head_impl[2]._vptr_ContainerScanState = (_func_int **)0x0;
    _Var11._M_head_impl =
         (this->current_container).
         super_unique_ptr<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::roaring::ContainerScanState_*,_std::default_delete<duckdb::roaring::ContainerScanState>_>
         .super__Head_base<0UL,_duckdb::roaring::ContainerScanState_*,_false>._M_head_impl;
    (this->current_container).
    super_unique_ptr<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::roaring::ContainerScanState_*,_std::default_delete<duckdb::roaring::ContainerScanState>_>
    .super__Head_base<0UL,_duckdb::roaring::ContainerScanState_*,_false>._M_head_impl =
         _Var6._M_head_impl;
  }
  if (_Var11._M_head_impl != (ContainerScanState *)0x0) {
    (*(_Var11._M_head_impl)->_vptr_ContainerScanState[1])();
  }
  pCVar7 = unique_ptr<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>,_true>
           ::operator->(&this->current_container);
  (*pCVar7->_vptr_ContainerScanState[4])(pCVar7);
  pCVar8 = unique_ptr<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>,_true>
           ::operator*(&this->current_container);
  if (internal_offset != 0) {
    iVar10 = pCVar8->scanned_count + internal_offset;
    if (iVar10 == pCVar8->container_size) {
      pCVar8->scanned_count = iVar10;
    }
    else {
      (*pCVar8->_vptr_ContainerScanState[3])(pCVar8,internal_offset);
    }
  }
LAB_016f112b:
  pCVar8 = unique_ptr<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>,_true>
           ::operator*(&this->current_container);
  return pCVar8;
}

Assistant:

ContainerScanState &RoaringScanState::LoadContainer(idx_t container_index, idx_t internal_offset) {
	if (UseContainerStateCache(container_index, internal_offset)) {
		return *current_container;
	}
	auto metadata = GetContainerMetadata(container_index);
	auto data_ptr = GetStartOfContainerData(container_index);

	auto segment_count = segment.count.load();
	auto start_of_container = container_index * ROARING_CONTAINER_SIZE;
	auto container_size = MinValue<idx_t>(segment_count - start_of_container, ROARING_CONTAINER_SIZE);
	if (metadata.IsUncompressed()) {
		current_container = make_uniq<BitsetContainerScanState>(container_index, container_size,
		                                                        reinterpret_cast<validity_t *>(data_ptr));
	} else if (metadata.IsRun()) {
		D_ASSERT(metadata.IsInverted());
		auto number_of_runs = metadata.NumberOfRuns();
		if (number_of_runs >= COMPRESSED_RUN_THRESHOLD) {
			auto segments = data_ptr;
			data_ptr = segments + COMPRESSED_SEGMENT_COUNT;
			current_container = make_uniq<CompressedRunContainerScanState>(container_index, container_size,
			                                                               number_of_runs, segments, data_ptr);
		} else {
			D_ASSERT(AlignValue<sizeof(RunContainerRLEPair)>(data_ptr) == data_ptr);
			current_container =
			    make_uniq<RunContainerScanState>(container_index, container_size, number_of_runs, data_ptr);
		}
	} else {
		auto cardinality = metadata.Cardinality();
		if (cardinality >= COMPRESSED_ARRAY_THRESHOLD) {
			auto segments = data_ptr;
			data_ptr = segments + COMPRESSED_SEGMENT_COUNT;
			if (metadata.IsInverted()) {
				current_container = make_uniq<CompressedArrayContainerScanState<NULLS>>(
				    container_index, container_size, cardinality, segments, data_ptr);
			} else {
				current_container = make_uniq<CompressedArrayContainerScanState<NON_NULLS>>(
				    container_index, container_size, cardinality, segments, data_ptr);
			}
		} else {
			D_ASSERT(AlignValue<sizeof(uint16_t)>(data_ptr) == data_ptr);
			if (metadata.IsInverted()) {
				current_container =
				    make_uniq<ArrayContainerScanState<NULLS>>(container_index, container_size, cardinality, data_ptr);
			} else {
				current_container = make_uniq<ArrayContainerScanState<NON_NULLS>>(container_index, container_size,
				                                                                  cardinality, data_ptr);
			}
		}
	}

	current_container->Verify();

	auto &scan_state = *current_container;
	if (internal_offset) {
		Skip(scan_state, internal_offset);
	}
	return *current_container;
}